

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall Net::send_with_retry(Net *this,string *request)

{
  int iVar1;
  
  do {
    iVar1 = BIO_write((BIO *)this->sock,(request->_M_dataplus)._M_p,
                      (int)request->_M_string_length + 1);
    if (0 < iVar1) {
      return;
    }
    iVar1 = BIO_test_flags((BIO *)this->sock,8);
  } while (iVar1 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"send error",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  this->closed = 1;
  return;
}

Assistant:

void Net::send_with_retry(std::string request){
	while(BIO_write(sock,request.c_str(),request.size()+1)<=0){
		if(!BIO_should_retry(sock)){
			std::cout<<"send error"<<std::endl;
			closed=1;
			return;
		}
	}
}